

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentFragmentImpl.cpp
# Opt level: O0

DOMNode * __thiscall
xercesc_4_0::DOMDocumentFragmentImpl::cloneNode(DOMDocumentFragmentImpl *this,bool deep)

{
  DOMNodeImpl *this_00;
  DOMDocument *doc;
  DOMDocumentFragmentImpl *this_01;
  DOMNode *newNode;
  bool deep_local;
  DOMDocumentFragmentImpl *this_local;
  
  this_00 = xercesc_4_0::castToNodeImpl((DOMNode *)this);
  doc = DOMNodeImpl::getOwnerDocument(this_00);
  this_01 = (DOMDocumentFragmentImpl *)operator_new(0x60,doc,DOCUMENT_FRAGMENT_OBJECT);
  DOMDocumentFragmentImpl(this_01,this,deep);
  DOMNodeImpl::callUserDataHandlers(&this->fNode,NODE_CLONED,(DOMNode *)this,(DOMNode *)this_01);
  return (DOMNode *)this_01;
}

Assistant:

DOMNode *DOMDocumentFragmentImpl::cloneNode(bool deep) const
{
    DOMNode* newNode = new (castToNodeImpl(this)->getOwnerDocument(), DOMMemoryManager::DOCUMENT_FRAGMENT_OBJECT) DOMDocumentFragmentImpl(*this, deep);
    fNode.callUserDataHandlers(DOMUserDataHandler::NODE_CLONED, this, newNode);
    return newNode;
}